

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::changeCoeff(Highs *this,HighsInt row,HighsInt col,double value)

{
  uint in_EDX;
  uint in_ESI;
  Highs *in_RDI;
  double in_XMM0_Qa;
  HighsLogOptions *log_options_;
  double abs_value;
  HighsStatus local_4;
  
  if (((int)in_ESI < 0) || ((in_RDI->model_).lp_.num_row_ <= (int)in_ESI)) {
    highsLogUser(&(in_RDI->options_).super_HighsOptionsStruct.log_options,kError,
                 "Row %d supplied to Highs::changeCoeff is not in the range [0, %d]\n",(ulong)in_ESI
                 ,(ulong)(uint)(in_RDI->model_).lp_.num_row_);
    local_4 = kError;
  }
  else if (((int)in_EDX < 0) || ((in_RDI->model_).lp_.num_col_ <= (int)in_EDX)) {
    highsLogUser(&(in_RDI->options_).super_HighsOptionsStruct.log_options,kError,
                 "Col %d supplied to Highs::changeCoeff is not in the range [0, %d]\n",(ulong)in_EDX
                 ,(ulong)(uint)(in_RDI->model_).lp_.num_col_);
    local_4 = kError;
  }
  else {
    log_options_ = (HighsLogOptions *)ABS(in_XMM0_Qa);
    if ((0.0 < (double)log_options_) &&
       ((double)log_options_ <= (in_RDI->options_).super_HighsOptionsStruct.small_matrix_value)) {
      highsLogUser(log_options_,
                   SUB84((in_RDI->options_).super_HighsOptionsStruct.small_matrix_value,0),
                   (char *)&(in_RDI->options_).super_HighsOptionsStruct.log_options,4,
                   "|Value| of %g supplied to Highs::changeCoeff is in (0, %g]: zeroes any existing coefficient, otherwise ignored\n"
                  );
    }
    changeCoefficientInterface(in_RDI,in_ESI,in_EDX,in_XMM0_Qa);
    local_4 = returnFromHighs((Highs *)CONCAT44(row,col),value._4_4_);
  }
  return local_4;
}

Assistant:

HighsStatus Highs::changeCoeff(const HighsInt row, const HighsInt col,
                               const double value) {
  if (row < 0 || row >= model_.lp_.num_row_) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Row %" HIGHSINT_FORMAT
                 " supplied to Highs::changeCoeff is not in the range [0, "
                 "%" HIGHSINT_FORMAT "]\n",
                 row, model_.lp_.num_row_);
    return HighsStatus::kError;
  }
  if (col < 0 || col >= model_.lp_.num_col_) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Col %" HIGHSINT_FORMAT
                 " supplied to Highs::changeCoeff is not in the range [0, "
                 "%" HIGHSINT_FORMAT "]\n",
                 col, model_.lp_.num_col_);
    return HighsStatus::kError;
  }
  const double abs_value = std::fabs(value);
  if (0 < abs_value && abs_value <= options_.small_matrix_value) {
    highsLogUser(options_.log_options, HighsLogType::kWarning,
                 "|Value| of %g supplied to Highs::changeCoeff is in (0, %g]: "
                 "zeroes any existing coefficient, otherwise ignored\n",
                 abs_value, options_.small_matrix_value);
  }
  changeCoefficientInterface(row, col, value);
  return returnFromHighs(HighsStatus::kOk);
}